

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O3

TIntermNode * __thiscall
glslang::TParseContext::handleReturnValue(TParseContext *this,TSourceLoc *loc,TIntermTyped *value)

{
  TType *pTVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TIntermTyped *expression;
  undefined4 extraout_var_03;
  TIntermBranch *this_00;
  undefined4 extraout_var_04;
  char *pcVar5;
  TIntermediate *this_01;
  _func_int **pp_Var6;
  
  iVar4 = (*(value->super_TIntermNode)._vptr_TIntermNode[0x1e])(value);
  storage16BitAssignmentCheck(this,loc,(TType *)CONCAT44(extraout_var,iVar4),"return");
  (this->super_TParseContextBase).functionReturnsValue = true;
  iVar4 = (*((this->super_TParseContextBase).currentFunctionType)->_vptr_TType[7])();
  if (iVar4 == 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"void function cannot return a value","return","");
    this_00 = TIntermediate::addBranch
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,EOpReturn
                         ,loc);
    goto LAB_004223ae;
  }
  pTVar1 = (this->super_TParseContextBase).currentFunctionType;
  iVar4 = (*(value->super_TIntermNode)._vptr_TIntermNode[0x1e])(value);
  bVar2 = TType::operator==(pTVar1,(TType *)CONCAT44(extraout_var_00,iVar4));
  if (bVar2) {
    iVar4 = (*(value->super_TIntermNode)._vptr_TIntermNode[0x1e])(value);
    cVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar4) + 0x168))
                      ((long *)CONCAT44(extraout_var_01,iVar4));
    if (cVar3 == '\0') {
      iVar4 = (*(value->super_TIntermNode)._vptr_TIntermNode[0x1e])(value);
      cVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar4) + 0x158))
                        ((long *)CONCAT44(extraout_var_02,iVar4));
      if (cVar3 != '\0') goto LAB_00422254;
    }
    else {
LAB_00422254:
      pp_Var6 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      if ((this->super_TParseContextBase).super_TParseVersions.spvVersion.spv == 0) {
        iVar4 = (*pp_Var6[8])(this,"GL_ARB_bindless_texture");
        if ((char)iVar4 != '\0') goto LAB_0042239a;
        pp_Var6 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar5 = 
        "sampler or image can be used as return type only when the extension GL_ARB_bindless_texture enabled"
        ;
      }
      else {
        pcVar5 = "sampler or image cannot be used as return type when generating SPIR-V";
      }
LAB_0042237d:
      (*pp_Var6[0x2d])(this,loc,pcVar5,"return","");
    }
LAB_0042239a:
    this_01 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    expression = value;
  }
  else {
    expression = TIntermediate::addConversion
                           ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                            EOpReturn,(this->super_TParseContextBase).currentFunctionType,value);
    if (expression == (TIntermTyped *)0x0) {
      pp_Var6 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar5 = "type does not match, or is not convertible to, the function\'s return type";
      goto LAB_0042237d;
    }
    pTVar1 = (this->super_TParseContextBase).currentFunctionType;
    iVar4 = (*(expression->super_TIntermNode)._vptr_TIntermNode[0x1e])(expression);
    bVar2 = TType::operator==(pTVar1,(TType *)CONCAT44(extraout_var_03,iVar4));
    if (!bVar2) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"cannot convert return value to function return type","return","");
    }
    if ((this->super_TParseContextBase).super_TParseVersions.version < 0x1a4) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                (this,loc,
                 "type conversion on return values was not explicitly allowed until version 420",
                 "return","");
    }
    this_01 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
  }
  this_00 = TIntermediate::addBranch(this_01,EOpReturn,expression,loc);
LAB_004223ae:
  iVar4 = (*((this->super_TParseContextBase).currentFunctionType)->_vptr_TType[0xb])();
  TIntermBranch::updatePrecision(this_00,*(uint *)(CONCAT44(extraout_var_04,iVar4) + 8) >> 0x19 & 7)
  ;
  return &this_00->super_TIntermNode;
}

Assistant:

TIntermNode* TParseContext::handleReturnValue(const TSourceLoc& loc, TIntermTyped* value)
{
    storage16BitAssignmentCheck(loc, value->getType(), "return");

    functionReturnsValue = true;
    TIntermBranch* branch = nullptr;
    if (currentFunctionType->getBasicType() == EbtVoid) {
        error(loc, "void function cannot return a value", "return", "");
        branch = intermediate.addBranch(EOpReturn, loc);
    } else if (*currentFunctionType != value->getType()) {
        TIntermTyped* converted = intermediate.addConversion(EOpReturn, *currentFunctionType, value);
        if (converted) {
            if (*currentFunctionType != converted->getType())
                error(loc, "cannot convert return value to function return type", "return", "");
            if (version < 420)
                warn(loc, "type conversion on return values was not explicitly allowed until version 420",
                     "return", "");
            branch = intermediate.addBranch(EOpReturn, converted, loc);
        } else {
            error(loc, "type does not match, or is not convertible to, the function's return type", "return", "");
            branch = intermediate.addBranch(EOpReturn, value, loc);
        }
    } else {
        if (value->getType().isTexture() || value->getType().isImage()) {
            if (spvVersion.spv != 0)
                error(loc, "sampler or image cannot be used as return type when generating SPIR-V", "return", "");
            else if (!extensionTurnedOn(E_GL_ARB_bindless_texture))
                error(loc, "sampler or image can be used as return type only when the extension GL_ARB_bindless_texture enabled", "return", "");
        }
        branch = intermediate.addBranch(EOpReturn, value, loc);
    }
    branch->updatePrecision(currentFunctionType->getQualifier().precision);
    return branch;
}